

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_bst.h
# Opt level: O3

int * __thiscall
CP::map_bst<int,_int,_std::less<int>_>::operator[]
          (map_bst<int,_int,_std::less<int>_> *this,int *key)

{
  uint uVar1;
  uint uVar2;
  node *pnVar3;
  node *pnVar4;
  map_bst<int,_int,_std::less<int>_> *pmVar5;
  ValueT VVar6;
  node *pnVar7;
  
  uVar1 = *key;
  VVar6.second = 0;
  VVar6.first = uVar1;
  pnVar3 = this->mRoot;
  if (this->mRoot == (node *)0x0) {
    pnVar7 = (node *)0x0;
  }
  else {
    do {
      pnVar4 = pnVar3;
      uVar2 = (pnVar4->data).first;
      if (uVar2 == uVar1) goto LAB_0010146a;
      pnVar3 = (&pnVar4->left)[(int)uVar2 <= (int)uVar1];
      pnVar7 = pnVar4;
    } while ((&pnVar4->left)[(int)uVar2 <= (int)uVar1] != (node *)0x0);
  }
  pnVar4 = (node *)operator_new(0x20);
  pnVar4->data = VVar6;
  pnVar4->left = (node *)0x0;
  pnVar4->right = (node *)0x0;
  pnVar4->parent = pnVar7;
  pmVar5 = this;
  if (pnVar7 != (node *)0x0) {
    pmVar5 = (map_bst<int,_int,_std::less<int>_> *)
             (&pnVar7->left + ((pnVar7->data).first <= (int)uVar1));
  }
  pmVar5->mRoot = pnVar4;
  this->mSize = this->mSize + 1;
LAB_0010146a:
  return &(pnVar4->data).second;
}

Assistant:

MappedT& operator[](const KeyT& key) {
      node *parent = NULL;
      node *ptr = find_node(key, mRoot, parent);
      if (ptr == NULL) {
        ptr = new node(std::make_pair(key,MappedT()),NULL,NULL,parent);
        child_link(parent, key) = ptr;
        mSize++;
      }
      return ptr->data.second;
    }